

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzellipse3d.cpp
# Opt level: O1

void __thiscall
pzgeom::TPZEllipse3D::GradX<Fad<double>>
          (TPZEllipse3D *this,TPZFMatrix<double> *cornerco,TPZVec<Fad<double>_> *par,
          TPZFMatrix<Fad<double>_> *gradx)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  int j;
  Fad<double> *pFVar6;
  int i_2;
  int i_1;
  double dVar7;
  Fad<double> angle;
  Fad<double> dangledqsi;
  TPZFMatrix<Fad<double>_> axloc;
  TPZFNMatrix<3,_Fad<double>_> dxcoglob;
  TPZFNMatrix<3,_Fad<double>_> dxcoloc;
  undefined1 local_3a0 [32];
  Fad<double> local_380;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> local_360;
  Fad<double> local_340;
  undefined1 local_320 [24];
  double *pdStack_308;
  Fad<double> *local_300;
  Fad<double> *pFStack_2f8;
  int64_t local_2f0;
  TPZVec<int> local_2e8;
  int local_2c8 [6];
  undefined **local_2b0;
  Fad<double> *local_2a8;
  int64_t iStack_2a0;
  int64_t local_298;
  Fad<double> local_290;
  Fad<double> local_270;
  undefined1 local_250 [32];
  Fad<double> *local_230;
  TPZFNMatrix<3,_Fad<double>_> local_140;
  
  dVar7 = this->fAngleFinal - this->fAngleIni;
  local_340.val_ = dVar7 * 0.5;
  local_340.dx_.num_elts = 0;
  local_340.dx_.ptr_to_data = (double *)0x0;
  local_340.defaultVal = 0.0;
  pFVar6 = par->fStore;
  local_380.val_ = (pFVar6->val_ + 1.0) * 0.5 * dVar7 + this->fAngleIni;
  iVar1 = (pFVar6->dx_).num_elts;
  local_380.dx_.num_elts = 0;
  local_380.dx_.ptr_to_data = (double *)0x0;
  if (0 < (long)iVar1) {
    local_380.dx_.num_elts = iVar1;
    local_380.dx_.ptr_to_data = (double *)operator_new__((long)iVar1 << 3);
  }
  local_380.defaultVal = 0.0;
  lVar2 = (long)(pFVar6->dx_).num_elts;
  if (0 < lVar2) {
    lVar5 = 0;
    do {
      local_380.dx_.ptr_to_data[lVar5] = (pFVar6->dx_).ptr_to_data[lVar5] * 0.5 * dVar7;
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  local_250._0_8_ = (_func_int **)0x0;
  local_250._8_4_ = 0;
  local_250._16_8_ = (double *)0x0;
  local_250._24_8_ = 0.0;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&local_140,3,1,(Fad<double> *)local_250);
  Fad<double>::~Fad((Fad<double> *)local_250);
  local_320._0_8_ = (_func_int **)0x0;
  local_320._8_8_ = (ulong)(uint)local_320._12_4_ << 0x20;
  local_320._16_8_ = (double *)0x0;
  pdStack_308 = (double *)0x0;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<3,_Fad<double>_> *)local_250,3,1,(Fad<double> *)local_320);
  Fad<double>::~Fad((Fad<double> *)local_320);
  dVar7 = this->fsAxeX;
  FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_3a0,&local_380);
  FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_320,(FadFuncSin<Fad<double>_> *)local_3a0);
  Fad<double>::~Fad((Fad<double> *)local_3a0);
  local_360.fadexpr_.left_.constant_ = -dVar7;
  local_360.fadexpr_.left_.defaultVal = 0.0;
  local_360.fadexpr_.right_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_320;
  if ((0 < local_140.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
           super_TPZBaseMatrix.fRow) &&
     (0 < local_140.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix
          .fCol)) {
    Fad<double>::operator=(local_140.super_TPZFMatrix<Fad<double>_>.fElem,&local_360);
    Fad<double>::~Fad((Fad<double> *)(local_320 + 8));
    dVar7 = this->fsAxeY;
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_3a0,&local_380);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_320,(FadFuncCos<Fad<double>_> *)local_3a0
              );
    Fad<double>::~Fad((Fad<double> *)local_3a0);
    local_360.fadexpr_.left_.defaultVal = 0.0;
    local_360.fadexpr_.left_.constant_ = dVar7;
    local_360.fadexpr_.right_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_320;
    if ((1 < local_140.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
             super_TPZBaseMatrix.fRow) &&
       (0 < local_140.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
            super_TPZBaseMatrix.fCol)) {
      Fad<double>::operator=
                (local_140.super_TPZFMatrix<Fad<double>_>.fElem + 1,
                 (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
                 &local_360);
      Fad<double>::~Fad((Fad<double> *)(local_320 + 8));
      local_320._8_8_ = 1.48219693752374e-323;
      local_320._16_8_ = (double *)0x3;
      pdStack_308 = (double *)((ulong)pdStack_308 & 0xffffffffffff0000);
      local_320._0_8_ = &PTR__TPZFMatrix_01846648;
      local_300 = (Fad<double> *)0x0;
      pFStack_2f8 = (Fad<double> *)0x0;
      local_2f0 = 0;
      TPZVec<int>::TPZVec(&local_2e8,0);
      local_2e8.fStore = local_2c8;
      local_2e8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_2e8.fNElements = 0;
      local_2e8.fNAlloc = 0;
      local_2b0 = &PTR__TPZVec_01846938;
      local_2a8 = (Fad<double> *)0x0;
      iStack_2a0 = 0;
      local_298 = 0;
      puVar3 = (undefined8 *)operator_new__(0x128);
      *puVar3 = 9;
      lVar2 = 0;
      pFVar6 = (Fad<double> *)(puVar3 + 1);
      do {
        Fad<double>::Fad(pFVar6);
        lVar2 = lVar2 + -0x20;
        pFVar6 = pFVar6 + 1;
      } while (lVar2 != -0x120);
      lVar2 = 0;
      local_300 = (Fad<double> *)(puVar3 + 1);
      do {
        lVar5 = 0;
        do {
          if (((long)local_320._8_8_ <= lVar2) || ((long)local_320._16_8_ <= lVar5)) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar4 = local_320._8_8_ * lVar5;
          local_300[lVar4 + lVar2].val_ =
               (this->fAxes).super_TPZFMatrix<double>.fElem
               [(this->fAxes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow * lVar5 + lVar2];
          if (local_300[lVar4 + lVar2].dx_.num_elts != 0) {
            local_3a0._0_8_ = (Fad<double> *)0x0;
            Vector<double>::operator=(&local_300[lVar4 + lVar2].dx_,(double *)local_3a0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      local_270.val_ = 1.0;
      local_270.dx_.num_elts = 0;
      local_270.dx_.ptr_to_data = (double *)0x0;
      local_270.defaultVal = 0.0;
      local_290.val_ = 0.0;
      local_290.dx_.num_elts = 0;
      local_290.dx_.ptr_to_data = (double *)0x0;
      local_290.defaultVal = 0.0;
      TPZFMatrix<Fad<double>_>::MultAdd
                ((TPZFMatrix<Fad<double>_> *)local_320,&local_140.super_TPZFMatrix<Fad<double>_>,
                 &local_140.super_TPZFMatrix<Fad<double>_>,(TPZFMatrix<Fad<double>_> *)local_250,
                 &local_270,&local_290,1);
      Fad<double>::~Fad(&local_290);
      Fad<double>::~Fad(&local_270);
      lVar2 = 0;
      lVar5 = 0;
      while( true ) {
        if ((CONCAT44(local_250._12_4_,local_250._8_4_) <= lVar5) || ((long)local_250._16_8_ < 1)) {
          TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_3a0._8_8_ = (long)&local_230->val_ + lVar2;
        local_3a0._0_8_ = &local_340;
        if (((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar5) ||
           ((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) break;
        Fad<double>::operator=
                  ((Fad<double> *)((long)&gradx->fElem->val_ + lVar2),
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_3a0);
        lVar5 = lVar5 + 1;
        lVar2 = lVar2 + 0x20;
        if (lVar5 == 3) {
          TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_320);
          local_250._0_8_ = &PTR__TPZFNMatrix_01877ab8;
          lVar2 = 0xf0;
          do {
            Fad<double>::~Fad((Fad<double> *)(local_250 + lVar2));
            lVar2 = lVar2 + -0x20;
          } while (lVar2 != 0x70);
          TPZFMatrix<Fad<double>_>::~TPZFMatrix
                    ((TPZFMatrix<Fad<double>_> *)local_250,&PTR_PTR_01877d70);
          local_140.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix
          .super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01877ab8;
          lVar2 = 0xf0;
          do {
            Fad<double>::~Fad((Fad<double> *)
                              ((long)&((TPZFMatrix<Fad<double>_> *)
                                      (&((TPZFMatrix<Fad<double>_> *)
                                        (&local_140.super_TPZFMatrix<Fad<double>_>.fPivot + -1))->
                                        fPivot + -1))->fPivot + lVar2 + 0xffffffffffffffc8U));
            lVar2 = lVar2 + -0x20;
          } while (lVar2 != 0x70);
          TPZFMatrix<Fad<double>_>::~TPZFMatrix
                    (&local_140.super_TPZFMatrix<Fad<double>_>,&PTR_PTR_01877d70);
          Fad<double>::~Fad(&local_380);
          Fad<double>::~Fad(&local_340);
          return;
        }
      }
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZEllipse3D::GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
{
    REAL delangle = fAngleFinal - fAngleIni;
    T dangledqsi = 1./2.*delangle;
    T angle = fAngleIni + (par[0]+1.)/2.*delangle;
    TPZFNMatrix<3,T> dxcoloc(3,1,0.),dxcoglob(3,1,0.);
    dxcoloc(0,0) = -fsAxeX*sin(angle);
    dxcoloc(1,0) = fsAxeY*cos(angle);
    int transp = 1;
    TPZFMatrix<T> axloc(3,3);
    for (int i=0; i<3; i++) {
        for (int j=0; j<3; j++) {
            axloc(i,j) = fAxes.GetVal(i,j);
        }
    }
    axloc.MultAdd(dxcoloc, dxcoloc, dxcoglob,1.,0.,transp);
    for (int i=0; i<3; i++) {
        gradx(i,0) = dangledqsi*dxcoglob(i,0);
    }

}